

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void cpu_x86_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  uint uVar1;
  uint uVar2;
  
  if (((env->cr[0] & 1) != 0) && ((env->eflags & 0x20000) == 0)) {
    helper_load_seg_x86_64(env,seg_reg,selector);
    return;
  }
  uVar1 = 0xf300;
  if (((uint)env->eflags >> 0x11 & 1) == 0) {
    uVar1 = 0x9300;
  }
  env->segs[seg_reg].selector = selector & 0xffffU;
  env->segs[seg_reg].base = (ulong)((selector & 0xffffU) << 4);
  env->segs[seg_reg].limit = 0xffff;
  env->segs[seg_reg].flags = uVar1;
  if (seg_reg == 2) {
    env->hflags = env->hflags & 0xfffffffc | uVar1 >> 0xd & 3;
    cpu_sync_bndcs_hflags_x86_64(env);
  }
  else if (seg_reg == 1) {
    env->hflags = env->hflags & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
  }
  uVar1 = env->hflags;
  uVar2 = env->segs[2].flags >> 0x11 & 0x20;
  if (-1 < (short)uVar1) {
    if ((((env->cr[0] & 1) == 0) || ((uVar1 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
      uVar2 = uVar2 | 0x40;
    }
    else {
      uVar2 = uVar2 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                            env->segs[2].base != 0) << 6;
    }
  }
  env->hflags = uVar1 & 0xffffff9f | uVar2;
  return;
}

Assistant:

void cpu_x86_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    if (!(env->cr[0] & CR0_PE_MASK) || (env->eflags & VM_MASK)) {
        int dpl = (env->eflags & VM_MASK) ? 3 : 0;
        selector &= 0xffff;
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               (selector << 4), 0xffff,
                               DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                               DESC_A_MASK | (dpl << DESC_DPL_SHIFT));
    } else {
        helper_load_seg(env, seg_reg, selector);
    }
}